

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O0

verifier<jwt::default_clock> * __thiscall
jwt::verifier<jwt::default_clock>::allow_algorithm<jwt::algorithm::rs256>
          (verifier<jwt::default_clock> *this,rs256 *alg)

{
  mapped_type *this_00;
  string local_48;
  undefined1 local_28 [24];
  rs256 *alg_local;
  verifier<jwt::default_clock> *this_local;
  
  local_28._16_8_ = alg;
  alg_local = (rs256 *)this;
  std::
  make_shared<jwt::verifier<jwt::default_clock>::algo<jwt::algorithm::rs256>,jwt::algorithm::rs256&>
            ((rs256 *)local_28);
  algorithm::rsa::name_abi_cxx11_(&local_48,&alg->super_rsa);
  this_00 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jwt::verifier<jwt::default_clock>::algo_base>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jwt::verifier<jwt::default_clock>::algo_base>_>_>_>
            ::operator[](&this->algs,&local_48);
  std::shared_ptr<jwt::verifier<jwt::default_clock>::algo_base>::operator=
            (this_00,(shared_ptr<jwt::verifier<jwt::default_clock>::algo<jwt::algorithm::rs256>_> *)
                     local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::shared_ptr<jwt::verifier<jwt::default_clock>::algo<jwt::algorithm::rs256>_>::~shared_ptr
            ((shared_ptr<jwt::verifier<jwt::default_clock>::algo<jwt::algorithm::rs256>_> *)local_28
            );
  return this;
}

Assistant:

verifier& allow_algorithm(Algorithm alg) {
			algs[alg.name()] = std::make_shared<algo<Algorithm>>(alg);
			return *this;
		}